

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

void helics::detail::convertFromBinary(byte *data,complex<double> *val)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  
  *(undefined8 *)val->_M_value = *(undefined8 *)(data + 8);
  *(undefined8 *)(val->_M_value + 8) = *(undefined8 *)(data + 0x10);
  if ((*data & 1) != 0) {
    puVar2 = val->_M_value + 7;
    lVar3 = 0;
    do {
      uVar1 = val->_M_value[lVar3];
      val->_M_value[lVar3] = *puVar2;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar3 != 4);
    puVar2 = val->_M_value + 0xf;
    lVar3 = 0;
    do {
      uVar1 = val->_M_value[lVar3 + 8];
      val->_M_value[lVar3 + 8] = *puVar2;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar3 != 4);
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::complex<double>& val)
{
    // https://en.cppreference.com/w/cpp/numeric/complex
    //  the layout used here is guaranteed by the standard
    std::memcpy(&reinterpret_cast<double(&)[2]>(val)[0], data + 8, 8);
    std::memcpy(&reinterpret_cast<double(&)[2]>(val)[1], data + 16, 8);
    if ((data[0] & endianMask) != littleEndianCode) {
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val));
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val) + 8);
    }
}